

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O3

Ptr __thiscall core::image::raw_to_float_image(image *this,ConstPtr *image)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  element_type *peVar5;
  pointer puVar6;
  Image<float> *__p;
  invalid_argument *this_00;
  uint uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  ulong uVar9;
  float fVar10;
  Ptr PVar11;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    __p = (Image<float> *)operator_new(0x30);
    (__p->super_TypedImageBase<float>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<float>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<float>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_00128b60;
    *(Image<float> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    plVar4 = *(long **)this;
    peVar5 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar1 = (peVar5->super_TypedImageBase<unsigned_short>).super_ImageBase.w;
    iVar2 = (peVar5->super_TypedImageBase<unsigned_short>).super_ImageBase.h;
    iVar3 = (peVar5->super_TypedImageBase<unsigned_short>).super_ImageBase.c;
    (**(code **)(*plVar4 + 0x40))(plVar4);
    *(int *)(plVar4 + 1) = iVar1;
    *(int *)((long)plVar4 + 0xc) = iVar2;
    *(int *)(plVar4 + 2) = iVar3;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)(plVar4 + 3),(long)(iVar2 * iVar1 * iVar3));
    peVar5 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar6 = (peVar5->super_TypedImageBase<unsigned_short>).data.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&(peVar5->super_TypedImageBase<unsigned_short>).data.
                                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                          ._M_impl.super__Vector_impl_data + 8) - (long)puVar6) >> 1
                  );
    _Var8._M_pi = extraout_RDX;
    if (0 < (int)uVar7) {
      _Var8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x18);
      uVar9 = 0;
      do {
        fVar10 = (float)puVar6[uVar9] / 65535.0;
        if (fVar10 <= 0.0) {
          fVar10 = 0.0;
        }
        if (1.0 <= fVar10) {
          fVar10 = 1.0;
        }
        *(float *)((long)&(_Var8._M_pi)->_vptr__Sp_counted_base + uVar9 * 4) = fVar10;
        uVar9 = uVar9 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar9);
    }
    PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var8._M_pi;
    PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

FloatImage::Ptr
raw_to_float_image (RawImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    FloatImage::Ptr img = FloatImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        float const value = static_cast<float>(image->at(i)) / 65535.0f;
        img->at(i) = std::min(1.0f, std::max(0.0f, value));
    }
    return img;
}